

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::BlobProto::ByteSizeLong(BlobProto *this)

{
  long lVar1;
  uint uVar2;
  UnknownFieldSet *unknown_fields;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  int value;
  
  iVar7 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = BlobProto::unknown_fields(this);
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar3 = (ulong)(uint)(this->data_).current_size_;
  lVar6 = uVar3 * 4;
  if (uVar3 != 0) {
    iVar7 = (int)lVar6;
    sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    sVar5 = sVar5 + sVar4 + 1;
  }
  this->_data_cached_byte_size_ = iVar7;
  lVar6 = sVar5 + lVar6;
  uVar3 = (ulong)(uint)(this->diff_).current_size_;
  lVar1 = uVar3 * 4;
  iVar7 = 0;
  if (uVar3 == 0) {
    value = 0;
  }
  else {
    value = (int)lVar1;
    sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar6 = lVar6 + sVar5 + 1;
  }
  this->_diff_cached_byte_size_ = value;
  lVar6 = lVar6 + lVar1;
  uVar3 = (ulong)(uint)(this->double_data_).current_size_;
  lVar1 = uVar3 * 8;
  if (uVar3 != 0) {
    iVar7 = (int)lVar1;
    sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    lVar6 = lVar6 + sVar5 + 1;
  }
  this->_double_data_cached_byte_size_ = iVar7;
  lVar6 = lVar6 + lVar1;
  uVar3 = (ulong)(uint)(this->double_diff_).current_size_;
  lVar1 = uVar3 * 8;
  if (uVar3 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = (int)lVar1;
    sVar5 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    lVar6 = lVar6 + sVar5 + 1;
  }
  this->_double_diff_cached_byte_size_ = iVar7;
  sVar5 = lVar6 + lVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x1f) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobShape>
                        (this->shape_);
      sVar5 = sVar5 + sVar4 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->num_);
      sVar5 = sVar5 + sVar4 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->channels_);
      sVar5 = sVar5 + sVar4 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 8) != 0) {
      sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->height_);
      sVar5 = sVar5 + sVar4 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 0x10) != 0) {
      sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->width_);
      sVar5 = sVar5 + sVar4 + 1;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t BlobProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BlobProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float data = 5 [packed = true];
  {
    unsigned int count = this->data_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float diff = 6 [packed = true];
  {
    unsigned int count = this->diff_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_data = 8 [packed = true];
  {
    unsigned int count = this->double_data_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_diff = 9 [packed = true];
  {
    unsigned int count = this->double_diff_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.BlobShape shape = 7;
    if (has_shape()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->shape_);
    }

    // optional int32 num = 1 [default = 0];
    if (has_num()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num());
    }

    // optional int32 channels = 2 [default = 0];
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 3 [default = 0];
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 4 [default = 0];
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}